

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::DeadStoreInstr(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  ArgSlot AVar4;
  SymID id;
  RegSlot RVar5;
  Func *pFVar6;
  undefined4 *puVar7;
  Opnd *this_00;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  JITTimeFunctionBody *this_01;
  RegSlot byteCodeRegSlot;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  undefined1 auStack_78 [4];
  BVIndex symId;
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  PropertySym *unusedPropertySym;
  undefined1 local_40 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv;
  BasicBlock *block;
  Instr *instr_local;
  BackwardPass *this_local;
  
  tempBv.lastUsedNodePrevNextField = (Type)this->currentBlock;
  bVar2 = IsTraceEnabled(this);
  if (bVar2) {
    Output::Print(L"Deadstore instr: ");
    IR::Instr::Dump(instr);
  }
  this->numDeadStore = this->numDeadStore + 1;
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if (bVar2) {
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)local_40,this->tempAlloc);
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)local_40,
               this->currentBlock->byteCodeUpwardExposedUsed);
    tempBv2.lastUsedNodePrevNextField = (Type)0x0;
    GlobOpt::TrackByteCodeSymUsed
              (instr,this->currentBlock->byteCodeUpwardExposedUsed,
               (PropertySym **)&tempBv2.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->tempAlloc);
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
               this->currentBlock->byteCodeUpwardExposedUsed);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
               (BVSparse<Memory::JitArenaAllocator> *)local_40);
    for (__startIndex = _auStack_78; __startIndex != (Type_conflict)0x0;
        __startIndex = __startIndex->next) {
      _unit.word._0_4_ = __startIndex->startIndex;
      stackSym = (StackSym *)(__startIndex->data).word;
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
      while (_unit.word._4_4_ != 0xffffffff) {
        id = (Type)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
        pSVar9 = SymTable::FindStackSym(this->func->m_symTable,id);
        IVar3 = StackSym::GetType(pSVar9);
        if (IVar3 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1f55,"(stackSym->GetType() == TyVar)","stackSym->GetType() == TyVar"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pFVar6 = StackSym::GetByteCodeFunc(pSVar9);
        if (pFVar6 == this->func) {
          RVar5 = StackSym::GetByteCodeRegSlot(pSVar9);
          if (RVar5 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1f5a,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                               "byteCodeRegSlot != Js::Constants::NoRegister");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if (this->currentBlock->byteCodeRestoreSyms[RVar5] != pSVar9) {
            if (this->currentBlock->byteCodeRestoreSyms[RVar5] != (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1f5e,
                                 "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                 ,"Can\'t have two active lifetime for the same byte code register")
              ;
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            this->currentBlock->byteCodeRestoreSyms[RVar5] = pSVar9;
          }
        }
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
      }
      if (__startIndex == (Type_conflict)0x0) break;
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_40);
  }
  if ((this->preOpBailOutInstrToProcess != (Instr *)0x0) &&
     (this->preOpBailOutInstrToProcess != instr)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1f69,
                       "(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr)",
                       "!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this->preOpBailOutInstrToProcess = (Instr *)0x0;
  bVar2 = DoMarkTempObjectVerify(this);
  if (bVar2) {
    ObjectTempVerify::NotifyDeadStore
              (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
  }
  if (instr->m_opcode == ArgIn_A) {
    this_00 = IR::Instr::GetSrc1(instr);
    pSVar8 = IR::Opnd::AsSymOpnd(this_00);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    AVar4 = StackSym::GetParamSlotNum(pSVar9);
    if (AVar4 == 1) {
      this_01 = Func::GetJITFunctionBody(this->func);
      bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_01);
      if (!bVar2) goto LAB_004e4466;
    }
    if (this->func->argInsCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1f7a,"(this->func->argInsCount > 0)","this->func->argInsCount > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this->func->argInsCount = this->func->argInsCount - 1;
  }
LAB_004e4466:
  TraceDeadStoreOfInstrsForScopeObjectRemoval(this);
  BasicBlock::RemoveInstr((BasicBlock *)tempBv.lastUsedNodePrevNextField,instr);
  return true;
}

Assistant:

bool
BackwardPass::DeadStoreInstr(IR::Instr *instr)
{
    BasicBlock * block = this->currentBlock;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("Deadstore instr: "));
        instr->Dump();
    }
    this->numDeadStore++;
#endif

    // Before we remove the dead store, we need to track the byte code uses
    if (this->DoByteCodeUpwardExposedUsed())
    {
#if DBG
        BVSparse<JitArenaAllocator> tempBv(this->tempAlloc);
        tempBv.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
#endif
        PropertySym *unusedPropertySym = nullptr;

        GlobOpt::TrackByteCodeSymUsed(instr, this->currentBlock->byteCodeUpwardExposedUsed, &unusedPropertySym);

#if DBG
        BVSparse<JitArenaAllocator> tempBv2(this->tempAlloc);
        tempBv2.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
        tempBv2.Minus(&tempBv);
        FOREACH_BITSET_IN_SPARSEBV(symId, &tempBv2)
        {
            StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
            Assert(stackSym->GetType() == TyVar);
            // TODO: We can only track first level function stack syms right now
            if (stackSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                {
                    AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
#endif
    }

    // If this is a pre-op bailout instruction, we may have saved it for bailout info processing. It's being removed now, so no
    // need to process the bailout info anymore.
    Assert(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr);
    preOpBailOutInstrToProcess = nullptr;

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyDeadStore(instr, this);
    }
#endif


    if (instr->m_opcode == Js::OpCode::ArgIn_A)
    {
        // Ignore tracking ArgIn for "this" as argInsCount only tracks other
        // params, unless it is a AsmJS function (which doesn't have a "this").
        if (instr->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() != 1 || func->GetJITFunctionBody()->IsAsmJsMode())
        {
            Assert(this->func->argInsCount > 0);
            this->func->argInsCount--;
        }
    }

    TraceDeadStoreOfInstrsForScopeObjectRemoval();

    block->RemoveInstr(instr);
    return true;
}